

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_cpols.cc
# Opt level: O0

void print_qualifiers(BIO *out,stack_st_POLICYQUALINFO *quals,int indent)

{
  int iVar1;
  POLICYQUALINFO *pPVar2;
  POLICYQUALINFO *qualinfo;
  size_t i;
  int indent_local;
  stack_st_POLICYQUALINFO *quals_local;
  BIO *out_local;
  
  qualinfo = (POLICYQUALINFO *)0x0;
  while( true ) {
    pPVar2 = (POLICYQUALINFO *)sk_POLICYQUALINFO_num(quals);
    if (pPVar2 <= qualinfo) break;
    pPVar2 = sk_POLICYQUALINFO_value(quals,(size_t)qualinfo);
    iVar1 = OBJ_obj2nid((ASN1_OBJECT *)pPVar2->pqualid);
    if (iVar1 == 0xa4) {
      BIO_printf((BIO *)out,"%*sCPS: %.*s\n",(ulong)(uint)indent,"",
                 (ulong)(uint)((pPVar2->d).cpsuri)->length,((pPVar2->d).cpsuri)->data);
    }
    else if (iVar1 == 0xa5) {
      BIO_printf((BIO *)out,"%*sUser Notice:\n",(ulong)(uint)indent,"");
      print_notice(out,(pPVar2->d).usernotice,indent + 2);
    }
    else {
      BIO_printf((BIO *)out,"%*sUnknown Qualifier: ",(ulong)(indent + 2),"");
      i2a_ASN1_OBJECT((BIO *)out,(ASN1_OBJECT *)pPVar2->pqualid);
      BIO_puts((BIO *)out,"\n");
    }
    qualinfo = (POLICYQUALINFO *)((long)&qualinfo->pqualid + 1);
  }
  return;
}

Assistant:

static void print_qualifiers(BIO *out, const STACK_OF(POLICYQUALINFO) *quals,
                             int indent) {
  for (size_t i = 0; i < sk_POLICYQUALINFO_num(quals); i++) {
    const POLICYQUALINFO *qualinfo = sk_POLICYQUALINFO_value(quals, i);
    switch (OBJ_obj2nid(qualinfo->pqualid)) {
      case NID_id_qt_cps:
        BIO_printf(out, "%*sCPS: %.*s\n", indent, "",
                   qualinfo->d.cpsuri->length, qualinfo->d.cpsuri->data);
        break;

      case NID_id_qt_unotice:
        BIO_printf(out, "%*sUser Notice:\n", indent, "");
        print_notice(out, qualinfo->d.usernotice, indent + 2);
        break;

      default:
        BIO_printf(out, "%*sUnknown Qualifier: ", indent + 2, "");

        i2a_ASN1_OBJECT(out, qualinfo->pqualid);
        BIO_puts(out, "\n");
        break;
    }
  }
}